

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::select_multiple::add(select_multiple *this,string *opt,string *id,bool selected)

{
  value_type *__x;
  long in_RDI;
  element *this_00;
  bool in_stack_ffffffffffffff1f;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  
  __x = (value_type *)(in_RDI + 0x208);
  this_00 = (element *)&stack0xffffffffffffff18;
  element::element((element *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::push_back((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
               *)this_00,__x);
  element::~element(this_00);
  return;
}

Assistant:

void select_multiple::add(std::string const &opt,std::string const &id,bool selected)
{
	elements_.push_back(element(id,opt,selected));
}